

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_enc(AES256_ctx *ctx,uchar *key,size_t key_len,uchar *bytes,size_t bytes_len,
            uchar *bytes_out)

{
  ulong blocks;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t key_len_local;
  uchar *key_local;
  AES256_ctx *ctx_local;
  
  blocks = bytes_len >> 4;
  if (key_len == 0x10) {
    AES128_init((AES128_ctx *)ctx,key);
    AES128_encrypt((AES128_ctx *)ctx,blocks,bytes_out,bytes);
  }
  else if (key_len == 0x18) {
    AES192_init((AES192_ctx *)ctx,key);
    AES192_encrypt((AES192_ctx *)ctx,blocks,bytes_out,bytes);
  }
  else if (key_len == 0x20) {
    AES256_init(ctx,key);
    AES256_encrypt(ctx,blocks,bytes_out,bytes);
  }
  return;
}

Assistant:

static void aes_enc(AES256_ctx *ctx,
                    const unsigned char *key, size_t key_len,
                    const unsigned char *bytes, size_t bytes_len,
                    unsigned char *bytes_out)
{
    bytes_len /= AES_BLOCK_LEN;

    switch (key_len) {
    case AES_KEY_LEN_128:
        AES128_init((AES128_ctx *)ctx, key);
        AES128_encrypt((AES128_ctx *)ctx, bytes_len, bytes_out, bytes);
        break;

    case AES_KEY_LEN_192:
        AES192_init((AES192_ctx *)ctx, key);
        AES192_encrypt((AES192_ctx *)ctx, bytes_len, bytes_out, bytes);
        break;

    case AES_KEY_LEN_256:
        AES256_init(ctx, key);
        AES256_encrypt(ctx, bytes_len, bytes_out, bytes);
        break;
    }
}